

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalMapViewOfFile
                    (CPalThread *pThread,HANDLE hFileMappingObject,DWORD dwDesiredAccess,
                    DWORD dwFileOffsetHigh,DWORD dwFileOffsetLow,SIZE_T dwNumberOfBytesToMap,
                    LPVOID *ppvBaseAddress)

{
  BOOL BVar1;
  INT __prot;
  int iVar2;
  int *piVar3;
  _LIST_ENTRY *p_Var4;
  PLIST_ENTRY _EX_ListHead;
  PLIST_ENTRY _EX_Blink;
  PMAPPED_VIEW_LIST pNewView;
  int flags_1;
  INT prot;
  int flags;
  LPVOID pvBaseAddress;
  IDataLock *pProcessLocalDataLock;
  CFileMappingProcessLocalData *pProcessLocalData;
  CFileMappingImmutableData *pImmutableData;
  IPalObject *pMappingObject;
  _LIST_ENTRY *p_Stack_30;
  PAL_ERROR palError;
  SIZE_T dwNumberOfBytesToMap_local;
  DWORD local_20;
  DWORD dwFileOffsetLow_local;
  DWORD dwFileOffsetHigh_local;
  DWORD dwDesiredAccess_local;
  HANDLE hFileMappingObject_local;
  CPalThread *pThread_local;
  
  pMappingObject._4_4_ = 0;
  pImmutableData = (CFileMappingImmutableData *)0x0;
  pProcessLocalData = (CFileMappingProcessLocalData *)0x0;
  pProcessLocalDataLock = (IDataLock *)0x0;
  pvBaseAddress = (LPVOID)0x0;
  p_Stack_30 = (_LIST_ENTRY *)dwNumberOfBytesToMap;
  dwNumberOfBytesToMap_local._4_4_ = dwFileOffsetLow;
  local_20 = dwFileOffsetHigh;
  dwFileOffsetLow_local = dwDesiredAccess;
  _dwFileOffsetHigh_local = hFileMappingObject;
  hFileMappingObject_local = pThread;
  BVar1 = MAPContainsInvalidFlags(dwDesiredAccess);
  if (BVar1 != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x48a);
    fprintf(_stderr,
            "dwDesiredAccess can be one of FILE_MAP_WRITE, FILE_MAP_READ, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n"
           );
    pMappingObject._4_4_ = 0x57;
    goto LAB_0014fd74;
  }
  if ((local_20 != 0) || (dwNumberOfBytesToMap_local._4_4_ != 0)) {
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x491);
    fprintf(_stderr,"dwFileOffsetHigh and dwFileOffsetLow are always 0.\n");
    pMappingObject._4_4_ = 0x57;
    goto LAB_0014fd74;
  }
  pMappingObject._4_4_ =
       (**(code **)(*g_pObjectManager + 0x28))
                 (g_pObjectManager,hFileMappingObject_local,_dwFileOffsetHigh_local,&aotFileMapping,
                  dwFileOffsetLow_local,&pImmutableData);
  if (pMappingObject._4_4_ != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    goto LAB_0014fd74;
  }
  pMappingObject._4_4_ =
       (**(code **)(*(long *)pImmutableData->szFileName + 0x10))(pImmutableData,&pProcessLocalData);
  if (pMappingObject._4_4_ != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    goto LAB_0014fd74;
  }
  pMappingObject._4_4_ =
       (**(code **)(*(long *)pImmutableData->szFileName + 0x18))
                 (pImmutableData,hFileMappingObject_local,0,&pvBaseAddress,&pProcessLocalDataLock);
  if (pMappingObject._4_4_ != 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    goto LAB_0014fd74;
  }
  if (p_Stack_30 == (_LIST_ENTRY *)0x0) {
    p_Stack_30 = (_LIST_ENTRY *)(ulong)(uint)pProcessLocalData[0x400].UnixFd;
  }
  pMappingObject._4_4_ =
       MAPDesiredAccessAllowed
                 (pProcessLocalData[0x401].UnixFd,dwFileOffsetLow_local,
                  pProcessLocalData[0x403].UnixFd);
  if (pMappingObject._4_4_ != 0) goto LAB_0014fd74;
  InternalEnterCriticalSection((CPalThread *)hFileMappingObject_local,&mapping_critsec);
  if (dwFileOffsetLow_local == 1) {
    _prot = (_LIST_ENTRY *)
            mmap64((void *)0x0,(size_t)p_Stack_30,3,2,
                   *(int *)&pProcessLocalDataLock->_vptr_IDataLock,0);
LAB_0014fc29:
    if (_prot == (_LIST_ENTRY *)&DAT_ffffffffffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar3 = __errno_location();
      strerror(*piVar3);
      pMappingObject._4_4_ = 8;
    }
    else {
      p_Var4 = (_LIST_ENTRY *)InternalMalloc(0x38);
      if (p_Var4 == (_LIST_ENTRY *)0x0) {
        pMappingObject._4_4_ = 0x54f;
      }
      else {
        p_Var4[1].Blink = _prot;
        p_Var4[2].Flink = p_Stack_30;
        *(DWORD *)&p_Var4[2].Blink = dwFileOffsetLow_local;
        p_Var4[1].Flink = (_LIST_ENTRY *)pImmutableData;
        (*(code *)(p_Var4[1].Flink)->Flink[3].Blink)();
        p_Var4[3].Flink = (_LIST_ENTRY *)0x0;
        p_Var4->Flink = &MappedViewList;
        p_Var4->Blink = MappedViewList.Blink;
        (MappedViewList.Blink)->Flink = p_Var4;
        MappedViewList.Blink = p_Var4;
      }
      if ((pMappingObject._4_4_ == 0) || (iVar2 = munmap(_prot,(size_t)p_Stack_30), iVar2 != -1)) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        *ppvBaseAddress = _prot;
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
  }
  else {
    __prot = MAPFileMapToMmapFlags(dwFileOffsetLow_local);
    if (__prot != -1) {
      _prot = (_LIST_ENTRY *)
              mmap64((void *)0x0,(size_t)p_Stack_30,__prot,1,
                     *(int *)&pProcessLocalDataLock->_vptr_IDataLock,0);
      goto LAB_0014fc29;
    }
    fprintf(_stderr,"] %s %s:%d","InternalMapViewOfFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x537);
    fprintf(_stderr,"MapFileMapToMmapFlags failed!\n");
    pMappingObject._4_4_ = 0x54f;
  }
  InternalLeaveCriticalSection((CPalThread *)hFileMappingObject_local,&mapping_critsec);
LAB_0014fd74:
  if (pvBaseAddress != (LPVOID)0x0) {
    (*(code *)**pvBaseAddress)(pvBaseAddress,hFileMappingObject_local,0);
  }
  if (pImmutableData != (CFileMappingImmutableData *)0x0) {
    (**(code **)(*(long *)pImmutableData->szFileName + 0x40))
              (pImmutableData,hFileMappingObject_local);
  }
  return pMappingObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalMapViewOfFile(
    CPalThread *pThread,
    HANDLE hFileMappingObject,
    DWORD dwDesiredAccess,
    DWORD dwFileOffsetHigh,
    DWORD dwFileOffsetLow,
    SIZE_T dwNumberOfBytesToMap,
    LPVOID *ppvBaseAddress
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pMappingObject = NULL;
    CFileMappingImmutableData *pImmutableData = NULL;
    CFileMappingProcessLocalData *pProcessLocalData = NULL;
    IDataLock *pProcessLocalDataLock = NULL;
#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    PMAPPED_VIEW_LIST pReusedMapping = NULL;
#endif
    LPVOID pvBaseAddress = NULL;

    /* Sanity checks */
    if ( MAPContainsInvalidFlags( dwDesiredAccess ) )
    {
        ASSERT( "dwDesiredAccess can be one of FILE_MAP_WRITE, FILE_MAP_READ,"
               " FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto InternalMapViewOfFileExit;
    }

    if ( 0 != dwFileOffsetHigh || 0 != dwFileOffsetLow )
    {
        ASSERT( "dwFileOffsetHigh and dwFileOffsetLow are always 0.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto InternalMapViewOfFileExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFileMappingObject,
        &aotFileMapping,
        dwDesiredAccess,
        &pMappingObject
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to reference handle %p.\n",hFileMappingObject );
        goto InternalMapViewOfFileExit;
    }

    palError = pMappingObject->GetImmutableData(
        reinterpret_cast<void**>(&pImmutableData)
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to obtain object immutable data");
        goto InternalMapViewOfFileExit;
    }

    palError = pMappingObject->GetProcessLocalData(
        pThread,
        ReadLock,
        &pProcessLocalDataLock,
        reinterpret_cast<void**>(&pProcessLocalData)
        );

    if (NO_ERROR != palError)
    {
        ERROR( "Unable to obtain object process local data");
        goto InternalMapViewOfFileExit;
    }
    
    /* If dwNumberOfBytesToMap is 0, we need to map the entire file.
     * mmap doesn't do the same thing as Windows in that case, though,
     * so we use the file size instead. */
    if (0 == dwNumberOfBytesToMap)
    {
        dwNumberOfBytesToMap = pImmutableData->MaxSize;
    }

    palError = MAPDesiredAccessAllowed(
        pImmutableData->flProtect,
        dwDesiredAccess,
        pImmutableData->dwDesiredAccessWhenOpened
        );

    if (NO_ERROR != palError)
    {
        goto InternalMapViewOfFileExit;
    }

    InternalEnterCriticalSection(pThread, &mapping_critsec);

    if (FILE_MAP_COPY == dwDesiredAccess)
    {
        int flags = MAP_PRIVATE;

#if !HAVE_MMAP_DEV_ZERO
        if (pProcessLocalData->UnixFd == -1)
        {
            flags |= MAP_ANON;
        }
#endif
        pvBaseAddress = mmap(
            NULL,
            dwNumberOfBytesToMap,
            PROT_READ|PROT_WRITE,
            flags,
            pProcessLocalData->UnixFd,
            0
            );
    }
    else
    {
        INT prot = MAPFileMapToMmapFlags(dwDesiredAccess);
        if (prot != -1)
        {
            int flags = MAP_SHARED;

#if !HAVE_MMAP_DEV_ZERO
            if (pProcessLocalData->UnixFd == -1)
            {
                flags |= MAP_ANON;
            }
#endif

            pvBaseAddress = mmap(
                NULL,
                dwNumberOfBytesToMap,
                prot,
                flags,
                pProcessLocalData->UnixFd,
                0
                );

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
            if ((MAP_FAILED == pvBaseAddress) && (ENOMEM == errno))
            {
                /* Search in list of MAPPED_MEMORY_INFO for a shared mapping 
                   with the same inode number
                */
                TRACE("Mmap() failed with errno=ENOMEM probably for multiple mapping "
                      "limitation. Searching for a replacement among existing mappings\n");

                pReusedMapping = FindSharedMappingReplacement(
                    pThread,
                    pProcessLocalData->MappedFileDevNum,
                    pProcessLocalData->MappedFileInodeNum,
                    dwNumberOfBytesToMap,
                    0
                    );
                
                if (pReusedMapping)
                {
                    int ret;

                    TRACE("Mapping @ %p {sz=%d offs=%d} fully "
                          "contains the requested one {sz=%d offs=%d}: reusing it\n",
                          pReusedMapping->pNMHolder->address,
                          (int)pReusedMapping->pNMHolder->size,
                          (int)pReusedMapping->pNMHolder->offset,
                          dwNumberOfBytesToMap, 0);

                    /* Let's check the mapping's current protection */
                    ret = mprotect(pReusedMapping->pNMHolder->address,
                                   pReusedMapping->pNMHolder->size,
                                   prot | PROT_CHECK);
                    if (0 != ret)
                    {               
                        /* We need to raise the protection to the desired 
                           one. That will give write access to any read-only
                           mapping sharing this native mapping, but there is 
                           no way around this problem on systems that do not
                           allow more than one mapping per file region, per
                           process */
                        TRACE("Raising protections on mapping @ %p to 0x%x\n",
                              pReusedMapping->pNMHolder->address, prot);
                        ret = mprotect(pReusedMapping->pNMHolder->address,
                                   pReusedMapping->pNMHolder->size,
                                   prot);
                    }

                    if (ret != 0) 
                    {
                        ERROR( "Failed setting protections on reused mapping\n");

                        NativeMapHolderRelease(pThread, pReusedMapping->pNMHolder);
                        InternalFree(pReusedMapping);
                        pReusedMapping = NULL;
                    }
                }
            }
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        }
        else
        {
            ASSERT( "MapFileMapToMmapFlags failed!\n" );
            palError = ERROR_INTERNAL_ERROR;
            goto InternalMapViewOfFileLeaveCriticalSection;
        }
    }

    if (MAP_FAILED == pvBaseAddress
#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
         &&  (pReusedMapping == NULL)
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        )
    {
        ERROR( "mmap failed with code %s.\n", strerror( errno ) );
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto InternalMapViewOfFileLeaveCriticalSection;

    }

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    if (pReusedMapping != NULL)
    {
        //
        // Add a reference to the file mapping object the reused mapping
        // points to (note that it may be different than the object this
        // call was actually made against) and add the view to the global
        // list. All other initialization took place in
        // FindSharedMappingReplacement
        //
        
        pvBaseAddress = pReusedMapping->lpAddress;
        pReusedMapping->pFileMapping->AddReference();
        InsertTailList(&MappedViewList, &pReusedMapping->Link);
    }
    else 
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
    {
        //
        // Allocate and fill out a new view structure, and add it to
        // the global list.
        //
        
        PMAPPED_VIEW_LIST pNewView = (PMAPPED_VIEW_LIST)InternalMalloc(sizeof(*pNewView));
        if (NULL != pNewView)
        {
            pNewView->lpAddress = pvBaseAddress;
            pNewView->NumberOfBytesToMap = dwNumberOfBytesToMap;
            pNewView->dwDesiredAccess = dwDesiredAccess;
            pNewView->pFileMapping = pMappingObject;
            pNewView->pFileMapping->AddReference();
            pNewView->lpPEBaseAddress = 0;
            InsertTailList(&MappedViewList, &pNewView->Link);

#if ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
            pNewView->MappedFileDevNum = pProcessLocalData->MappedFileDevNum;
            pNewView->MappedFileInodeNum = pProcessLocalData->MappedFileInodeNum;
            
            pNewView->pNMHolder = NewNativeMapHolder(
                pThread,
                pvBaseAddress, 
                dwNumberOfBytesToMap,
                0,
                1
                );

            if (NULL == pNewView->pNMHolder)
            {
                pNewView->pFileMapping->ReleaseReference(pThread);
                RemoveEntryList(&pNewView->Link);
                InternalFree(pNewView);
                palError = ERROR_INTERNAL_ERROR;
            }
#endif // ONE_SHARED_MAPPING_PER_FILEREGION_PER_PROCESS
        }
        else
        {
            palError = ERROR_INTERNAL_ERROR;
        }

        if (NO_ERROR != palError)
        {
            if (-1 == munmap(pvBaseAddress, dwNumberOfBytesToMap))
            {
                ERROR("Unable to unmap the file. Expect trouble.\n");
                goto InternalMapViewOfFileLeaveCriticalSection;
            }
        }
    }
    
    TRACE( "Added %p to the list.\n", pvBaseAddress );
    *ppvBaseAddress = pvBaseAddress;

InternalMapViewOfFileLeaveCriticalSection:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

InternalMapViewOfFileExit:

    if (NULL != pProcessLocalDataLock)
    {
        pProcessLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pMappingObject)
    {
        pMappingObject->ReleaseReference(pThread);
    }

    return palError;
}